

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldBase::SyncRepeatedFieldWithMapNoLock(MapFieldBase *this)

{
  Arena *this_00;
  RepeatedPtrField<google::protobuf::Message> *elem;
  
  if (this->repeated_field_ != (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    return;
  }
  this_00 = this->arena_;
  if (this_00 == (Arena *)0x0) {
    elem = (RepeatedPtrField<google::protobuf::Message> *)operator_new(0x18);
    (elem->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
    (elem->super_RepeatedPtrFieldBase).current_size_ = 0;
    (elem->super_RepeatedPtrFieldBase).total_size_ = 0;
    (elem->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
  }
  else {
    elem = (RepeatedPtrField<google::protobuf::Message> *)
           Arena::AllocateAligned
                     (this_00,(type_info *)&RepeatedPtrField<google::protobuf::Message>::typeinfo,
                      0x18);
    (elem->super_RepeatedPtrFieldBase).arena_ = this_00;
    (elem->super_RepeatedPtrFieldBase).current_size_ = 0;
    (elem->super_RepeatedPtrFieldBase).total_size_ = 0;
    (elem->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    Arena::AddListNode(this_00,elem,
                       arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                      );
  }
  this->repeated_field_ = elem;
  return;
}

Assistant:

void MapFieldBase::SyncRepeatedFieldWithMapNoLock() const {
  if (repeated_field_ == NULL) {
    repeated_field_ = Arena::CreateMessage<RepeatedPtrField<Message> >(arena_);
  }
}